

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers.cpp
# Opt level: O0

void printSortedEvents(istream *input,ostream *output,string *format,string *dateFormat)

{
  bool bVar1;
  ClockSync *__args;
  iterator iVar2;
  iterator iVar3;
  reference ppVar4;
  string *in_RCX;
  string *in_RDX;
  ostream *in_RSI;
  Pair *p;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  ClockSync *in_stack_00000060;
  WriterProp *in_stack_00000068;
  Event *in_stack_00000070;
  anon_class_1_0_00000001 cmpClock;
  ostream *in_stack_00000078;
  PrettyPrinter *in_stack_00000080;
  Event *event;
  ostringstream stream;
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  buffer;
  PrettyPrinter pp;
  EventStream eventStream;
  IstreamEntryStream entryStream;
  istream *in_stack_fffffffffffffc08;
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  EventStream *in_stack_fffffffffffffc10;
  Event *in_stack_fffffffffffffc20;
  string *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  __normal_iterator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  in_stack_fffffffffffffc50;
  EntryStream *in_stack_fffffffffffffc70;
  EventStream *in_stack_fffffffffffffc78;
  string local_380 [32];
  string local_360 [32];
  Event *local_340;
  ostringstream local_338 [376];
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c0;
  string local_1a8 [32];
  string local_188 [128];
  EventStream local_108;
  string *local_20;
  string *local_18;
  ostream *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  binlog::IstreamEntryStream::IstreamEntryStream
            ((IstreamEntryStream *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  binlog::EventStream::EventStream(in_stack_fffffffffffffc10);
  std::__cxx11::string::string(local_188,local_18);
  std::__cxx11::string::string(local_1a8,local_20);
  binlog::PrettyPrinter::PrettyPrinter
            ((PrettyPrinter *)in_stack_fffffffffffffc50._M_current,in_stack_fffffffffffffc48,
             in_stack_fffffffffffffc40);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string(local_188);
  std::
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x103f8f);
  std::__cxx11::ostringstream::ostringstream(local_338);
  while( true ) {
    local_340 = binlog::EventStream::nextEvent(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
    if (local_340 == (Event *)0x0) break;
    std::__cxx11::string::string(local_360);
    std::__cxx11::ostringstream::str((string *)local_338);
    std::__cxx11::string::~string(local_360);
    in_stack_fffffffffffffc20 = local_340;
    binlog::EventStream::writerProp(&local_108);
    __args = binlog::EventStream::clockSync(&local_108);
    binlog::PrettyPrinter::printEvent
              (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,
               in_stack_00000060);
    in_stack_fffffffffffffc10 = (EventStream *)&local_340->clockValue;
    std::__cxx11::ostringstream::str();
    std::
    vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
    ::emplace_back<unsigned_long_const&,std::__cxx11::string>
              ((vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffc20,&__args->clockValue,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffc10);
    std::__cxx11::string::~string(local_380);
  }
  this = &local_1c0;
  iVar2 = std::
          vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::begin(this);
  iVar3 = std::
          vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(this);
  std::
  stable_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,std::__cxx11::string>*,std::vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>>,printSortedEvents(std::istream&,std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>
            (iVar2._M_current,iVar3._M_current);
  std::
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::begin(this);
  std::
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)in_stack_fffffffffffffc10,
                       (__normal_iterator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)this);
    if (!bVar1) break;
    ppVar4 = __gnu_cxx::
             __normal_iterator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator*((__normal_iterator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&stack0xfffffffffffffc50);
    std::operator<<(local_10,(string *)&ppVar4->second);
    __gnu_cxx::
    __normal_iterator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++((__normal_iterator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  *)&stack0xfffffffffffffc50);
  }
  std::__cxx11::ostringstream::~ostringstream(local_338);
  std::
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)in_stack_fffffffffffffc20);
  binlog::PrettyPrinter::~PrettyPrinter((PrettyPrinter *)in_stack_fffffffffffffc10);
  binlog::EventStream::~EventStream(in_stack_fffffffffffffc10);
  binlog::IstreamEntryStream::~IstreamEntryStream((IstreamEntryStream *)in_stack_fffffffffffffc10);
  return;
}

Assistant:

void printSortedEvents(std::istream& input, std::ostream& output, const std::string& format, const std::string& dateFormat)
{
  binlog::IstreamEntryStream entryStream(input);
  binlog::EventStream eventStream;
  binlog::PrettyPrinter pp(format, dateFormat);

  using Pair = std::pair<std::uint64_t /* clock */, std::string /* pretty printed event */>;
  std::vector<Pair> buffer;
  std::ostringstream stream;

  // buffer every event in input
  while (const binlog::Event* event = eventStream.nextEvent(entryStream))
  {
    stream.str({}); // reset stream
    pp.printEvent(stream, *event, eventStream.writerProp(), eventStream.clockSync());
    buffer.emplace_back(event->clockValue, stream.str());
  }

  // sort and print the the buffer
  const auto cmpClock = [](const Pair& p1, const Pair& p2) { return p1.first < p2.first; };
  std::stable_sort(buffer.begin(), buffer.end(), cmpClock);
  for (const Pair& p : buffer)
  {
    output << p.second;
  }
}